

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result wabt::ReadBinaryObjdump
                 (uint8_t *data,size_t size,ObjdumpOptions *options,ObjdumpState *state)

{
  Result RVar1;
  BinaryReaderObjdumpPrepass reader;
  ReadBinaryOptions local_1b8;
  Features local_18a;
  BinaryReaderObjdump local_178;
  
  local_18a.exceptions_enabled_ = false;
  local_18a.mutable_globals_enabled_ = true;
  local_18a.sat_float_to_int_enabled_ = true;
  local_18a.sign_extension_enabled_ = true;
  local_18a.simd_enabled_ = true;
  local_18a.threads_enabled_ = false;
  local_18a.function_references_enabled_ = false;
  local_18a.multi_value_enabled_ = true;
  local_18a.tail_call_enabled_ = false;
  local_18a.bulk_memory_enabled_ = true;
  local_18a.reference_types_enabled_ = true;
  local_18a.annotations_enabled_ = false;
  local_18a.code_metadata_enabled_ = false;
  local_18a.gc_enabled_ = false;
  local_18a.memory64_enabled_ = false;
  local_18a.multi_memory_enabled_ = false;
  local_18a.extended_const_enabled_ = false;
  local_18a.relaxed_simd_enabled_ = false;
  Features::EnableAll(&local_18a);
  local_1b8.log_stream = options->log_stream;
  local_1b8.features.extended_const_enabled_ = local_18a.extended_const_enabled_;
  local_1b8.features.relaxed_simd_enabled_ = local_18a.relaxed_simd_enabled_;
  local_1b8.features.mutable_globals_enabled_ = local_18a.mutable_globals_enabled_;
  local_1b8.features.sat_float_to_int_enabled_ = local_18a.sat_float_to_int_enabled_;
  local_1b8.features.sign_extension_enabled_ = local_18a.sign_extension_enabled_;
  local_1b8.features.simd_enabled_ = local_18a.simd_enabled_;
  local_1b8.features.threads_enabled_ = local_18a.threads_enabled_;
  local_1b8.features.function_references_enabled_ = local_18a.function_references_enabled_;
  local_1b8.features.multi_value_enabled_ = local_18a.multi_value_enabled_;
  local_1b8.features.exceptions_enabled_ = local_18a.exceptions_enabled_;
  local_1b8.features.bulk_memory_enabled_ = local_18a.bulk_memory_enabled_;
  local_1b8.features.reference_types_enabled_ = local_18a.reference_types_enabled_;
  local_1b8.features.tail_call_enabled_ = local_18a.tail_call_enabled_;
  local_1b8.features.annotations_enabled_ = local_18a.annotations_enabled_;
  local_1b8.features.code_metadata_enabled_ = local_18a.code_metadata_enabled_;
  local_1b8.features.gc_enabled_ = local_18a.gc_enabled_;
  local_1b8.features.memory64_enabled_ = local_18a.memory64_enabled_;
  local_1b8.features.multi_memory_enabled_ = local_18a.multi_memory_enabled_;
  local_1b8.read_debug_names = true;
  local_1b8.stop_on_first_error = false;
  local_1b8.fail_on_custom_section_error = false;
  local_1b8.skip_function_bodies = false;
  if (options->mode == Disassemble) {
    anon_unknown_15::BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
              (&local_178.super_BinaryReaderObjdumpBase,data,size,options,state);
    local_178.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
    _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001405d0;
    local_178.out_stream_._M_t.
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
         (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0;
    local_178._256_7_ = 0;
    local_178.table_index_._3_1_ = 0;
    local_178.next_data_reloc_ = 0;
    local_178.reading_elem_init_expr_ = false;
    local_178.reading_data_init_expr_ = false;
    local_178.reading_global_init_expr_ = false;
    local_178._271_1_ = 0;
    local_178.current_init_expr_.type = I32;
    local_178.current_init_expr_._4_4_ = 0;
    local_178.current_init_expr_.insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_178.current_init_expr_.insts.
                          super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffff0000);
    RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_178,&local_1b8);
  }
  else {
    if (options->mode != Prepass) {
      local_1b8.read_debug_names = true;
      local_1b8.stop_on_first_error = false;
      local_1b8.fail_on_custom_section_error = false;
      local_1b8.skip_function_bodies = true;
      anon_unknown_15::BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
                (&local_178.super_BinaryReaderObjdumpBase,data,size,options,state);
      local_178.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
      _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_00140cd8;
      FileStream::CreateStdout();
      local_178.next_data_reloc_ = 0;
      local_178.reading_elem_init_expr_ = false;
      local_178.reading_data_init_expr_ = false;
      local_178.reading_global_init_expr_ = false;
      local_178._256_7_ = 0;
      local_178.table_index_._3_1_ = 0;
      local_178.current_init_expr_.insts.
      super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.current_init_expr_.insts.
      super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
      local_178.current_init_expr_.insts.
      super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
      ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
      local_178.current_init_expr_.insts.
      super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
      local_178._298_8_ = 0;
      local_178._308_8_ = 0;
      local_178._316_8_ = 0;
      local_178.elem_offset_._4_4_ = 0;
      RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_178,&local_1b8);
      anon_unknown_15::BinaryReaderObjdump::~BinaryReaderObjdump(&local_178);
      return (Result)RVar1.enum_;
    }
    local_1b8.read_debug_names = true;
    local_1b8.stop_on_first_error = false;
    local_1b8.fail_on_custom_section_error = false;
    local_1b8.skip_function_bodies = true;
    anon_unknown_15::BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
              (&local_178.super_BinaryReaderObjdumpBase,data,size,options,state);
    local_178.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
    _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_0013f7c0;
    RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_178,&local_1b8);
  }
  anon_unknown_15::BinaryReaderObjdumpBase::~BinaryReaderObjdumpBase
            (&local_178.super_BinaryReaderObjdumpBase);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryObjdump(const uint8_t* data,
                         size_t size,
                         ObjdumpOptions* options,
                         ObjdumpState* state) {
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = false;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions read_options(features, options->log_stream, kReadDebugNames,
                                 kStopOnFirstError, kFailOnCustomSectionError);

  switch (options->mode) {
    case ObjdumpMode::Prepass: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdumpPrepass reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    case ObjdumpMode::Disassemble: {
      BinaryReaderObjdumpDisassemble reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    default: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdump reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
  }
}